

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

int mwTestBuffer(char *file,int line,void *p)

{
  int iVar1;
  mwData *mw_00;
  mwData *mw;
  void *p_local;
  int line_local;
  char *file_local;
  
  mwAutoInit();
  mw_00 = (mwData *)((long)p + (-(long)mwOverflowZoneSize - (long)mwDataSize));
  iVar1 = mwIsOwned(mw_00,file,line);
  if (iVar1 == 0) {
    file_local._4_4_ = 1;
  }
  else {
    file_local._4_4_ = mwTestBuf(mw_00,file,line);
  }
  return file_local._4_4_;
}

Assistant:

int mwTestBuffer(const char *file, int line, void *p)
{
	mwData *mw;

	mwAutoInit();

	/* do the quick ownership test */
	mw = (mwData *) mwBUFFER_TO_MW(p);

	if (mwIsOwned(mw, file, line)) {
		return mwTestBuf(mw, file, line);
	}
	return 1;
}